

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::setWall(int x,int y,char direction)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"setWall ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,direction);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::API::setWall(int x, int y, char direction) {
    std::cout << "setWall " << x << " " << y << " " << direction << std::endl;
}